

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int windowCodeOp(WindowCodeArg *p,int op,int regCountdown,int jumpOnEof)

{
  Parse *pParse_00;
  Window *pMWin_00;
  Vdbe *p_00;
  uint uVar1;
  int p2;
  int addr;
  int iVar2;
  int p2_00;
  int local_98;
  int local_94;
  int regTmp;
  int nReg;
  int regRowid2;
  int regRowid1;
  int addrNextRange;
  int lblDone;
  int bPeer;
  int addrContinue;
  Vdbe *v;
  int ret;
  Window *pMWin;
  Parse *pParse;
  int local_28;
  int reg;
  int csr;
  int jumpOnEof_local;
  int regCountdown_local;
  int op_local;
  WindowCodeArg *p_local;
  
  pParse_00 = p->pParse;
  pMWin_00 = p->pMWin;
  v._4_4_ = 0;
  p_00 = p->pVdbe;
  uVar1 = (uint)(pMWin_00->eFrmType != 'L');
  p2 = sqlite3VdbeMakeLabel(pParse_00);
  regRowid2 = 0;
  if ((op == 2) && (pMWin_00->eStart == 'Z')) {
    p_local._4_4_ = 0;
  }
  else {
    if (0 < regCountdown) {
      if (pMWin_00->eFrmType == 'Y') {
        regRowid2 = sqlite3VdbeCurrentAddr(p_00);
        if (op == 2) {
          if (pMWin_00->eStart == 'V') {
            windowCodeRangeTest(p,0x37,(p->current).csr,regCountdown,(p->start).csr,p2);
          }
          else {
            windowCodeRangeTest(p,0x39,(p->start).csr,regCountdown,(p->current).csr,p2);
          }
        }
        else {
          windowCodeRangeTest(p,0x36,(p->end).csr,regCountdown,(p->current).csr,p2);
        }
      }
      else {
        sqlite3VdbeAddOp3(p_00,0x3b,regCountdown,p2,1);
      }
    }
    if ((op == 1) && (pMWin_00->regStartRowid == 0)) {
      windowAggFinal(p,0);
    }
    addr = sqlite3VdbeCurrentAddr(p_00);
    if (((pMWin_00->eStart == pMWin_00->eEnd) && (regCountdown != 0)) && (pMWin_00->eFrmType == 'Y')
       ) {
      iVar2 = sqlite3GetTempReg(pParse_00);
      p2_00 = sqlite3GetTempReg(pParse_00);
      if (op == 2) {
        sqlite3VdbeAddOp2(p_00,0x87,(p->start).csr,iVar2);
        sqlite3VdbeAddOp2(p_00,0x87,(p->end).csr,p2_00);
        sqlite3VdbeAddOp3(p_00,0x39,p2_00,p2,iVar2);
      }
      else if (p->regRowid != 0) {
        sqlite3VdbeAddOp2(p_00,0x87,(p->end).csr,iVar2);
        sqlite3VdbeAddOp3(p_00,0x39,p->regRowid,p2,iVar2);
      }
      sqlite3ReleaseTempReg(pParse_00,iVar2);
      sqlite3ReleaseTempReg(pParse_00,p2_00);
    }
    if (op == 1) {
      local_28 = (p->current).csr;
      pParse._4_4_ = (p->current).reg;
      windowReturnOneRow(p);
    }
    else if (op == 2) {
      local_28 = (p->start).csr;
      pParse._4_4_ = (p->start).reg;
      if (pMWin_00->regStartRowid == 0) {
        windowAggStep(p,pMWin_00,local_28,1,p->regArg);
      }
      else {
        sqlite3VdbeAddOp2(p_00,0x56,pMWin_00->regStartRowid,1);
      }
    }
    else {
      local_28 = (p->end).csr;
      pParse._4_4_ = (p->end).reg;
      if (pMWin_00->regStartRowid == 0) {
        windowAggStep(p,pMWin_00,local_28,0,p->regArg);
      }
      else {
        sqlite3VdbeAddOp2(p_00,0x56,pMWin_00->regEndRowid,1);
      }
    }
    if (op == p->eDelete) {
      sqlite3VdbeAddOp1(p_00,0x82,local_28);
      sqlite3VdbeChangeP5(p_00,2);
    }
    if (jumpOnEof == 0) {
      iVar2 = sqlite3VdbeCurrentAddr(p_00);
      sqlite3VdbeAddOp2(p_00,0x27,local_28,iVar2 + 1 + uVar1);
      if (uVar1 != 0) {
        sqlite3VdbeAddOp2(p_00,9,0,p2);
      }
    }
    else {
      iVar2 = sqlite3VdbeCurrentAddr(p_00);
      sqlite3VdbeAddOp2(p_00,0x27,local_28,iVar2 + 2);
      v._4_4_ = sqlite3VdbeAddOp0(p_00,9);
    }
    if (uVar1 != 0) {
      if (pMWin_00->pOrderBy == (ExprList *)0x0) {
        local_94 = 0;
      }
      else {
        local_94 = pMWin_00->pOrderBy->nExpr;
      }
      if (local_94 == 0) {
        local_98 = 0;
      }
      else {
        local_98 = sqlite3GetTempRange(pParse_00,local_94);
      }
      windowReadPeerValues(p,local_28,local_98);
      windowIfNewPeer(pParse_00,pMWin_00->pOrderBy,local_98,pParse._4_4_,addr);
      sqlite3ReleaseTempRange(pParse_00,local_98,local_94);
    }
    if (regRowid2 != 0) {
      sqlite3VdbeAddOp2(p_00,9,0,regRowid2);
    }
    sqlite3VdbeResolveLabel(p_00,p2);
    p_local._4_4_ = v._4_4_;
  }
  return p_local._4_4_;
}

Assistant:

static int windowCodeOp(
 WindowCodeArg *p,                /* Context object */
 int op,                          /* WINDOW_RETURN_ROW, AGGSTEP or AGGINVERSE */
 int regCountdown,                /* Register for OP_IfPos countdown */
 int jumpOnEof                    /* Jump here if stepped cursor reaches EOF */
){
  int csr, reg;
  Parse *pParse = p->pParse;
  Window *pMWin = p->pMWin;
  int ret = 0;
  Vdbe *v = p->pVdbe;
  int addrContinue = 0;
  int bPeer = (pMWin->eFrmType!=TK_ROWS);

  int lblDone = sqlite3VdbeMakeLabel(pParse);
  int addrNextRange = 0;

  /* Special case - WINDOW_AGGINVERSE is always a no-op if the frame
  ** starts with UNBOUNDED PRECEDING. */
  if( op==WINDOW_AGGINVERSE && pMWin->eStart==TK_UNBOUNDED ){
    assert( regCountdown==0 && jumpOnEof==0 );
    return 0;
  }

  if( regCountdown>0 ){
    if( pMWin->eFrmType==TK_RANGE ){
      addrNextRange = sqlite3VdbeCurrentAddr(v);
      assert( op==WINDOW_AGGINVERSE || op==WINDOW_AGGSTEP );
      if( op==WINDOW_AGGINVERSE ){
        if( pMWin->eStart==TK_FOLLOWING ){
          windowCodeRangeTest(
              p, OP_Le, p->current.csr, regCountdown, p->start.csr, lblDone
          );
        }else{
          windowCodeRangeTest(
              p, OP_Ge, p->start.csr, regCountdown, p->current.csr, lblDone
          );
        }
      }else{
        windowCodeRangeTest(
            p, OP_Gt, p->end.csr, regCountdown, p->current.csr, lblDone
        );
      }
    }else{
      sqlite3VdbeAddOp3(v, OP_IfPos, regCountdown, lblDone, 1);
      VdbeCoverage(v);
    }
  }

  if( op==WINDOW_RETURN_ROW && pMWin->regStartRowid==0 ){
    windowAggFinal(p, 0);
  }
  addrContinue = sqlite3VdbeCurrentAddr(v);

  /* If this is a (RANGE BETWEEN a FOLLOWING AND b FOLLOWING) or
  ** (RANGE BETWEEN b PRECEDING AND a PRECEDING) frame, ensure the
  ** start cursor does not advance past the end cursor within the
  ** temporary table. It otherwise might, if (a>b). Also ensure that,
  ** if the input cursor is still finding new rows, that the end
  ** cursor does not go past it to EOF. */
  if( pMWin->eStart==pMWin->eEnd && regCountdown
   && pMWin->eFrmType==TK_RANGE
  ){
    int regRowid1 = sqlite3GetTempReg(pParse);
    int regRowid2 = sqlite3GetTempReg(pParse);
    if( op==WINDOW_AGGINVERSE ){
      sqlite3VdbeAddOp2(v, OP_Rowid, p->start.csr, regRowid1);
      sqlite3VdbeAddOp2(v, OP_Rowid, p->end.csr, regRowid2);
      sqlite3VdbeAddOp3(v, OP_Ge, regRowid2, lblDone, regRowid1);
      VdbeCoverage(v);
    }else if( p->regRowid ){
      sqlite3VdbeAddOp2(v, OP_Rowid, p->end.csr, regRowid1);
      sqlite3VdbeAddOp3(v, OP_Ge, p->regRowid, lblDone, regRowid1);
      VdbeCoverageNeverNull(v);
    }
    sqlite3ReleaseTempReg(pParse, regRowid1);
    sqlite3ReleaseTempReg(pParse, regRowid2);
    assert( pMWin->eStart==TK_PRECEDING || pMWin->eStart==TK_FOLLOWING );
  }

  switch( op ){
    case WINDOW_RETURN_ROW:
      csr = p->current.csr;
      reg = p->current.reg;
      windowReturnOneRow(p);
      break;

    case WINDOW_AGGINVERSE:
      csr = p->start.csr;
      reg = p->start.reg;
      if( pMWin->regStartRowid ){
        assert( pMWin->regEndRowid );
        sqlite3VdbeAddOp2(v, OP_AddImm, pMWin->regStartRowid, 1);
      }else{
        windowAggStep(p, pMWin, csr, 1, p->regArg);
      }
      break;

    default:
      assert( op==WINDOW_AGGSTEP );
      csr = p->end.csr;
      reg = p->end.reg;
      if( pMWin->regStartRowid ){
        assert( pMWin->regEndRowid );
        sqlite3VdbeAddOp2(v, OP_AddImm, pMWin->regEndRowid, 1);
      }else{
        windowAggStep(p, pMWin, csr, 0, p->regArg);
      }
      break;
  }

  if( op==p->eDelete ){
    sqlite3VdbeAddOp1(v, OP_Delete, csr);
    sqlite3VdbeChangeP5(v, OPFLAG_SAVEPOSITION);
  }

  if( jumpOnEof ){
    sqlite3VdbeAddOp2(v, OP_Next, csr, sqlite3VdbeCurrentAddr(v)+2);
    VdbeCoverage(v);
    ret = sqlite3VdbeAddOp0(v, OP_Goto);
  }else{
    sqlite3VdbeAddOp2(v, OP_Next, csr, sqlite3VdbeCurrentAddr(v)+1+bPeer);
    VdbeCoverage(v);
    if( bPeer ){
      sqlite3VdbeAddOp2(v, OP_Goto, 0, lblDone);
    }
  }

  if( bPeer ){
    int nReg = (pMWin->pOrderBy ? pMWin->pOrderBy->nExpr : 0);
    int regTmp = (nReg ? sqlite3GetTempRange(pParse, nReg) : 0);
    windowReadPeerValues(p, csr, regTmp);
    windowIfNewPeer(pParse, pMWin->pOrderBy, regTmp, reg, addrContinue);
    sqlite3ReleaseTempRange(pParse, regTmp, nReg);
  }

  if( addrNextRange ){
    sqlite3VdbeAddOp2(v, OP_Goto, 0, addrNextRange);
  }
  sqlite3VdbeResolveLabel(v, lblDone);
  return ret;
}